

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O0

void __thiscall
gulcalc::output_mean_mode1
          (gulcalc *this,OASIS_FLOAT tiv,prob_mean *pp,int bin_count,OASIS_FLOAT *gul_mean,
          OASIS_FLOAT *std_dev,OASIS_FLOAT *max_loss,vector<int,_std::allocator<int>_> *bin_ids)

{
  float fVar1;
  bool bVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  const_reference pvVar5;
  double dVar6;
  float local_6c;
  OASIS_FLOAT g2;
  probrec p;
  _Self local_58;
  iterator pos;
  float local_48;
  int bin_index;
  OASIS_FLOAT ctr_var;
  OASIS_FLOAT last_prob_to;
  OASIS_FLOAT *max_loss_local;
  OASIS_FLOAT *std_dev_local;
  OASIS_FLOAT *gul_mean_local;
  prob_mean *ppStack_20;
  int bin_count_local;
  prob_mean *pp_local;
  OASIS_FLOAT tiv_local;
  gulcalc *this_local;
  
  bin_index = 0;
  *gul_mean = 0.0;
  *std_dev = 0.0;
  local_48 = 0.0;
  ppStack_20 = pp;
  for (pos._M_node._4_4_ = 0; pos._M_node._4_4_ < bin_count;
      pos._M_node._4_4_ = pos._M_node._4_4_ + 1) {
    local_58._M_node =
         (_Base_ptr)
         std::
         map<prob_mean,_int,_std::less<prob_mean>,_std::allocator<std::pair<const_prob_mean,_int>_>_>
         ::find(&this->bin_map_,ppStack_20);
    p._4_8_ = std::
              map<prob_mean,_int,_std::less<prob_mean>,_std::allocator<std::pair<const_prob_mean,_int>_>_>
              ::end(&this->bin_map_);
    bVar2 = std::operator==(&local_58,(_Self *)&p.prob_to);
    if (bVar2) {
      sVar3 = std::
              map<prob_mean,_int,_std::less<prob_mean>,_std::allocator<std::pair<const_prob_mean,_int>_>_>
              ::size(&this->bin_map_);
      pmVar4 = std::
               map<prob_mean,_int,_std::less<prob_mean>,_std::allocator<std::pair<const_prob_mean,_int>_>_>
               ::operator[](&this->bin_map_,ppStack_20);
      *pmVar4 = (mapped_type)sVar3;
      std::vector<prob_mean,_std::allocator<prob_mean>_>::push_back(&this->bin_lookup_,ppStack_20);
    }
    pmVar4 = std::
             map<prob_mean,_int,_std::less<prob_mean>,_std::allocator<std::pair<const_prob_mean,_int>_>_>
             ::operator[](&this->bin_map_,ppStack_20);
    std::vector<int,_std::allocator<int>_>::push_back(bin_ids,pmVar4);
    if (pos._M_node._4_4_ == 0) {
      local_6c = 0.0;
    }
    else {
      local_6c = (float)bin_index;
    }
    fVar1 = ppStack_20->prob_to;
    p.prob_from = ppStack_20->bin_mean;
    bin_index = (int)ppStack_20->prob_to;
    *gul_mean = (fVar1 - local_6c) * p.prob_from * tiv + *gul_mean;
    local_48 = (fVar1 - local_6c) * p.prob_from * p.prob_from * tiv * tiv + local_48;
    ppStack_20 = ppStack_20 + 1;
  }
  *std_dev = local_48 - *gul_mean * *gul_mean;
  if (*std_dev <= 0.0 && *std_dev != 0.0) {
    *std_dev = 0.0;
  }
  dVar6 = std::sqrt((double)(ulong)(uint)*std_dev);
  *std_dev = SUB84(dVar6,0);
  pvVar5 = std::vector<damagebindictionary,_std::allocator<damagebindictionary>_>::operator[]
                     (this->damagebindictionary_vec_,(long)(bin_count + -1));
  *max_loss = tiv * pvVar5->bin_to;
  return;
}

Assistant:

void gulcalc::output_mean_mode1(const OASIS_FLOAT tiv, prob_mean *pp,
				const int bin_count, OASIS_FLOAT &gul_mean,
				OASIS_FLOAT &std_dev, OASIS_FLOAT &max_loss,
				std::vector<int> &bin_ids) {

	OASIS_FLOAT last_prob_to = 0;
	gul_mean = 0;
	std_dev = 0;
	OASIS_FLOAT ctr_var = 0;

	for (int bin_index = 0; bin_index < bin_count; bin_index++) {

		// Map prob_mean to integer for later lookup
		auto pos = bin_map_.find(*pp);
		if (pos == bin_map_.end()) {
			bin_map_[*pp] = bin_map_.size();
			bin_lookup_.push_back(*pp);
		}
		bin_ids.push_back(bin_map_[*pp]);

		probrec p;
		if (bin_index == 0) {
			p.prob_from = 0;
		} else {
			p.prob_from = last_prob_to;
		}
		p.prob_to = pp->prob_to;
		p.bin_mean = pp->bin_mean;
		last_prob_to = pp->prob_to;
		gul_mean = gul_mean + ((p.prob_to - p.prob_from) * p.bin_mean * tiv);
		ctr_var = ctr_var + ((p.prob_to - p.prob_from) * p.bin_mean * p.bin_mean * tiv * tiv);
		pp++;
	}

	OASIS_FLOAT g2 = gul_mean * gul_mean;
	std_dev = ctr_var - g2;
	if (std_dev < 0) std_dev = 0;
	std_dev = sqrt(std_dev);

	max_loss = tiv * (*damagebindictionary_vec_)[bin_count - 1].bin_to;
}